

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O2

void saucy_free(saucy *s)

{
  int *piVar1;
  Vec_Ptr_t *p;
  Abc_Ntk_t *pAVar2;
  Vec_Int_t *pVVar3;
  undefined8 *__ptr;
  int iVar4;
  long lVar5;
  
  if (s->undiffnons != (int *)0x0) {
    free(s->undiffnons);
    s->undiffnons = (int *)0x0;
  }
  if (s->diffnons != (int *)0x0) {
    free(s->diffnons);
    s->diffnons = (int *)0x0;
  }
  if (s->unpairs != (int *)0x0) {
    free(s->unpairs);
    s->unpairs = (int *)0x0;
  }
  if (s->pairs != (int *)0x0) {
    free(s->pairs);
    s->pairs = (int *)0x0;
  }
  if (s->thfront != (int *)0x0) {
    free(s->thfront);
    s->thfront = (int *)0x0;
  }
  if (s->threp != (int *)0x0) {
    free(s->threp);
    s->threp = (int *)0x0;
  }
  if (s->thnext != (int *)0x0) {
    free(s->thnext);
    s->thnext = (int *)0x0;
  }
  if (s->thprev != (int *)0x0) {
    free(s->thprev);
    s->thprev = (int *)0x0;
  }
  if (s->specmin != (int *)0x0) {
    free(s->specmin);
    s->specmin = (int *)0x0;
  }
  if (s->anctar != (int *)0x0) {
    free(s->anctar);
    s->anctar = (int *)0x0;
  }
  if (s->thsize != (int *)0x0) {
    free(s->thsize);
    s->thsize = (int *)0x0;
  }
  if (s->undifflev != (int *)0x0) {
    free(s->undifflev);
    s->undifflev = (int *)0x0;
  }
  if (s->difflev != (int *)0x0) {
    free(s->difflev);
    s->difflev = (int *)0x0;
  }
  if (s->diffs != (int *)0x0) {
    free(s->diffs);
    s->diffs = (int *)0x0;
  }
  if (s->diffmark != (char *)0x0) {
    free(s->diffmark);
    s->diffmark = (char *)0x0;
  }
  if (s->conncnts != (int *)0x0) {
    free(s->conncnts);
    s->conncnts = (int *)0x0;
  }
  if (s->unsupp != (int *)0x0) {
    free(s->unsupp);
    s->unsupp = (int *)0x0;
  }
  if (s->splitlev != (int *)0x0) {
    free(s->splitlev);
    s->splitlev = (int *)0x0;
  }
  if (s->splitfrom != (int *)0x0) {
    free(s->splitfrom);
    s->splitfrom = (int *)0x0;
  }
  if (s->splitwho != (int *)0x0) {
    free(s->splitwho);
    s->splitwho = (int *)0x0;
  }
  if (s->splitvar != (int *)0x0) {
    free(s->splitvar);
    s->splitvar = (int *)0x0;
  }
  piVar1 = (s->right).unlab;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (s->right).unlab = (int *)0x0;
  }
  piVar1 = (s->right).lab;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (s->right).lab = (int *)0x0;
  }
  piVar1 = (s->left).unlab;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (s->left).unlab = (int *)0x0;
  }
  piVar1 = (s->left).lab;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (s->left).lab = (int *)0x0;
  }
  if (s->theta != (int *)0x0) {
    free(s->theta);
    s->theta = (int *)0x0;
  }
  if (s->junk != (int *)0x0) {
    free(s->junk);
    s->junk = (int *)0x0;
  }
  if (s->gamma != (int *)0x0) {
    free(s->gamma);
    s->gamma = (int *)0x0;
  }
  if (s->start != (int *)0x0) {
    free(s->start);
    s->start = (int *)0x0;
  }
  if (s->prevnon != (int *)0x0) {
    free(s->prevnon);
    s->prevnon = (int *)0x0;
  }
  free(s->nextnon + -1);
  if (s->clist != (int *)0x0) {
    free(s->clist);
    s->clist = (int *)0x0;
  }
  if (s->ccount != (int *)0x0) {
    free(s->ccount);
    s->ccount = (int *)0x0;
  }
  if (s->count != (int *)0x0) {
    free(s->count);
    s->count = (int *)0x0;
  }
  if (s->bucket != (int *)0x0) {
    free(s->bucket);
    s->bucket = (int *)0x0;
  }
  if (s->stuff != (char *)0x0) {
    free(s->stuff);
    s->stuff = (char *)0x0;
  }
  piVar1 = (s->right).clen;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (s->right).clen = (int *)0x0;
  }
  piVar1 = (s->right).cfront;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (s->right).cfront = (int *)0x0;
  }
  piVar1 = (s->left).clen;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (s->left).clen = (int *)0x0;
  }
  piVar1 = (s->left).cfront;
  if (piVar1 != (int *)0x0) {
    free(piVar1);
    (s->left).cfront = (int *)0x0;
  }
  if (s->indmark != (char *)0x0) {
    free(s->indmark);
    s->indmark = (char *)0x0;
  }
  if (s->sinduce != (int *)0x0) {
    free(s->sinduce);
    s->sinduce = (int *)0x0;
  }
  if (s->ninduce != (int *)0x0) {
    free(s->ninduce);
    s->ninduce = (int *)0x0;
  }
  if (s->depAdj != (int *)0x0) {
    free(s->depAdj);
    s->depAdj = (int *)0x0;
  }
  if (s->depEdg != (int *)0x0) {
    free(s->depEdg);
    s->depEdg = (int *)0x0;
  }
  if (s->marks != (char *)0x0) {
    free(s->marks);
    s->marks = (char *)0x0;
  }
  for (lVar5 = 0; pAVar2 = s->pNtk, lVar5 < pAVar2->vPis->nSize; lVar5 = lVar5 + 1) {
    Vec_IntFree(s->iDep[lVar5]);
    Vec_IntFree(s->obs[lVar5]);
    Vec_PtrFree(s->topOrder[lVar5]);
  }
  for (lVar5 = 0; lVar5 < pAVar2->vPos->nSize; lVar5 = lVar5 + 1) {
    Vec_IntFree(s->oDep[lVar5]);
    Vec_IntFree(s->ctrl[lVar5]);
    pAVar2 = s->pNtk;
  }
  for (iVar4 = 0; iVar4 < s->randomVectorArray_sim1->nSize; iVar4 = iVar4 + 1) {
    pVVar3 = (Vec_Int_t *)Vec_PtrEntry(s->randomVectorArray_sim1,iVar4);
    Vec_IntFree(pVVar3);
  }
  for (iVar4 = 0; iVar4 < s->randomVectorArray_sim2->nSize; iVar4 = iVar4 + 1) {
    pVVar3 = (Vec_Int_t *)Vec_PtrEntry(s->randomVectorArray_sim2,iVar4);
    Vec_IntFree(pVVar3);
  }
  Vec_PtrFree(s->randomVectorArray_sim1);
  Vec_PtrFree(s->randomVectorArray_sim2);
  if (s->randomVectorSplit_sim1 != (int *)0x0) {
    free(s->randomVectorSplit_sim1);
    s->randomVectorSplit_sim1 = (int *)0x0;
  }
  if (s->randomVectorSplit_sim2 != (int *)0x0) {
    free(s->randomVectorSplit_sim2);
    s->randomVectorSplit_sim2 = (int *)0x0;
  }
  Abc_NtkDelete(s->pNtk_permuted);
  for (iVar4 = 0; p = s->satCounterExamples, iVar4 < p->nSize; iVar4 = iVar4 + 1) {
    __ptr = (undefined8 *)Vec_PtrEntry(p,iVar4);
    if ((void *)*__ptr != (void *)0x0) {
      free((void *)*__ptr);
      *__ptr = 0;
    }
    free((void *)__ptr[1]);
    free(__ptr);
  }
  Vec_PtrFree(p);
  if (s->pModel != (int *)0x0) {
    free(s->pModel);
    s->pModel = (int *)0x0;
  }
  if (s->iDep != (Vec_Int_t **)0x0) {
    free(s->iDep);
    s->iDep = (Vec_Int_t **)0x0;
  }
  if (s->oDep != (Vec_Int_t **)0x0) {
    free(s->oDep);
    s->oDep = (Vec_Int_t **)0x0;
  }
  if (s->obs != (Vec_Int_t **)0x0) {
    free(s->obs);
    s->obs = (Vec_Int_t **)0x0;
  }
  if (s->ctrl != (Vec_Int_t **)0x0) {
    free(s->ctrl);
    s->ctrl = (Vec_Int_t **)0x0;
  }
  free(s->topOrder);
  free(s);
  return;
}

Assistant:

void
saucy_free(struct saucy *s)
{
    int i;

    ABC_FREE(s->undiffnons);
    ABC_FREE(s->diffnons);
    ABC_FREE(s->unpairs);
    ABC_FREE(s->pairs);
    ABC_FREE(s->thfront);
    ABC_FREE(s->threp);
    ABC_FREE(s->thnext);
    ABC_FREE(s->thprev);
    ABC_FREE(s->specmin);
    ABC_FREE(s->anctar);
    ABC_FREE(s->thsize);
    ABC_FREE(s->undifflev);
    ABC_FREE(s->difflev);
    ABC_FREE(s->diffs);
    ABC_FREE(s->diffmark);
    ABC_FREE(s->conncnts);
    ABC_FREE(s->unsupp);
    ABC_FREE(s->splitlev);
    ABC_FREE(s->splitfrom);
    ABC_FREE(s->splitwho);
    ABC_FREE(s->splitvar);
    ABC_FREE(s->right.unlab);
    ABC_FREE(s->right.lab);
    ABC_FREE(s->left.unlab);
    ABC_FREE(s->left.lab);
    ABC_FREE(s->theta);
    ABC_FREE(s->junk);
    ABC_FREE(s->gamma);
    ABC_FREE(s->start);
    ABC_FREE(s->prevnon);
    free(s->nextnon-1);
    ABC_FREE(s->clist);
    ABC_FREE(s->ccount);
    ABC_FREE(s->count);
    ABC_FREE(s->bucket);
    ABC_FREE(s->stuff);
    ABC_FREE(s->right.clen);
    ABC_FREE(s->right.cfront);
    ABC_FREE(s->left.clen);
    ABC_FREE(s->left.cfront);
    ABC_FREE(s->indmark);
    ABC_FREE(s->sinduce);
    ABC_FREE(s->ninduce);
    ABC_FREE(s->depAdj);
    ABC_FREE(s->depEdg);
    ABC_FREE(s->marks);
    for (i = 0; i < Abc_NtkPiNum(s->pNtk); i++) {
        Vec_IntFree( s->iDep[i] );
        Vec_IntFree( s->obs[i] );
        Vec_PtrFree( s->topOrder[i] );
    }
    for (i = 0; i < Abc_NtkPoNum(s->pNtk); i++) {
        Vec_IntFree( s->oDep[i] );
        Vec_IntFree( s->ctrl[i] );
    }
    for (i = 0; i < Vec_PtrSize(s->randomVectorArray_sim1); i++)
        Vec_IntFree((Vec_Int_t *)Vec_PtrEntry(s->randomVectorArray_sim1, i));
    for (i = 0; i < Vec_PtrSize(s->randomVectorArray_sim2); i++)
        Vec_IntFree((Vec_Int_t *)Vec_PtrEntry(s->randomVectorArray_sim2, i));
    Vec_PtrFree( s->randomVectorArray_sim1 );
    Vec_PtrFree( s->randomVectorArray_sim2 );
    ABC_FREE(s->randomVectorSplit_sim1);
    ABC_FREE(s->randomVectorSplit_sim2);
    Abc_NtkDelete( s->pNtk_permuted );
    for (i = 0; i < Vec_PtrSize(s->satCounterExamples); i++) {
        struct sim_result * cex = (struct sim_result *)Vec_PtrEntry(s->satCounterExamples, i);
        ABC_FREE( cex->inVec );
        ABC_FREE( cex->outVec );
        ABC_FREE( cex );
    }
    Vec_PtrFree(s->satCounterExamples);
    ABC_FREE( s->pModel );
    ABC_FREE( s->iDep );
    ABC_FREE( s->oDep );
    ABC_FREE( s->obs );
    ABC_FREE( s->ctrl );
    ABC_FREE( s->topOrder );
    ABC_FREE(s);
}